

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_stats_scan_sse41_128_64.c
# Opt level: O2

parasail_result_t *
parasail_sg_flags_stats_table_scan_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  __m128i *palVar1;
  undefined1 (*pauVar2) [16];
  long *plVar3;
  uint uVar4;
  void *pvVar5;
  parasail_matrix_t *ppVar6;
  void *pvVar7;
  void *pvVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  uint uVar37;
  uint uVar38;
  parasail_result_t *ppVar39;
  __m128i *b;
  __m128i *b_00;
  __m128i *b_01;
  __m128i *b_02;
  __m128i *ptr;
  __m128i *b_03;
  __m128i *b_04;
  __m128i *b_05;
  __m128i *ptr_00;
  __m128i *ptr_01;
  __m128i *ptr_02;
  __m128i *ptr_03;
  __m128i *ptr_04;
  __m128i *ptr_05;
  int64_t *ptr_06;
  __m128i *palVar40;
  __m128i *palVar41;
  __m128i *palVar42;
  int iVar43;
  uint uVar44;
  uint uVar45;
  int iVar46;
  __m128i *palVar47;
  long lVar48;
  ulong uVar49;
  char *pcVar50;
  longlong extraout_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  uint uVar53;
  int iVar54;
  longlong lVar55;
  ulong size;
  __m128i *palVar56;
  __m128i *palVar57;
  char *__format;
  ulong uVar58;
  long lVar59;
  long lVar60;
  longlong lVar61;
  int iVar62;
  ulong uVar63;
  longlong lVar64;
  ulong uVar65;
  ulong uVar66;
  long lVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 extraout_XMM0 [16];
  __m128i alVar70;
  long lVar85;
  undefined1 extraout_XMM0_00 [16];
  undefined1 auVar71 [16];
  undefined1 extraout_XMM0_01 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 extraout_XMM0_02 [16];
  undefined1 auVar74 [16];
  undefined1 extraout_XMM0_03 [16];
  undefined1 auVar75 [16];
  undefined1 extraout_XMM0_04 [16];
  undefined1 auVar76 [16];
  undefined1 extraout_XMM0_05 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 extraout_XMM0_06 [16];
  undefined1 auVar84 [16];
  undefined1 extraout_XMM0_07 [16];
  longlong lVar86;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  longlong lVar95;
  undefined1 auVar94 [16];
  long lVar96;
  longlong lVar97;
  long lVar103;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  longlong lVar104;
  undefined1 auVar102 [16];
  longlong lVar105;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  longlong lVar108;
  __m128i_64_t B_2;
  undefined1 auVar109 [16];
  __m128i_64_t B_1;
  int64_t iVar110;
  undefined1 auVar111 [16];
  __m128i_64_t B;
  __m128i alVar112;
  __m128i alVar113;
  __m128i c;
  __m128i c_00;
  __m128i c_01;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i a_04;
  __m128i a_05;
  __m128i a_06;
  __m128i b_06;
  __m128i b_07;
  __m128i b_08;
  __m128i b_09;
  __m128i b_10;
  __m128i b_11;
  __m128i b_12;
  __m128i b_13;
  __m128i alVar114;
  __m128i alVar115;
  __m128i *local_3d8;
  undefined1 local_3b8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined4 local_2a0;
  undefined4 uStack_29c;
  long local_240;
  uint local_238;
  undefined8 local_228;
  ulong uStack_220;
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1c8 [16];
  long lStack_1b0;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  ulong uStack_150;
  undefined8 uStack_c0;
  __m128i_64_t h;
  size_t len;
  ulong uVar51;
  __m128i *palVar52;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar50 = "profile";
  }
  else {
    pvVar5 = (profile->profile64).score;
    if (pvVar5 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar50 = "profile->profile64.score";
    }
    else {
      ppVar6 = profile->matrix;
      if (ppVar6 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar50 = "profile->matrix";
      }
      else {
        uVar4 = profile->s1Len;
        if ((int)uVar4 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar50 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar50 = "s2";
        }
        else {
          uVar65 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            __format = "%s: %s must be > 0\n";
            pcVar50 = "s2Len";
          }
          else if (open < 0) {
            __format = "%s: %s must be >= 0\n";
            pcVar50 = "open";
          }
          else {
            if (-1 < gap) {
              uVar53 = uVar4 - 1;
              size = (ulong)uVar4 + 1 >> 1;
              uVar49 = (ulong)uVar53 % size;
              pvVar7 = (profile->profile64).matches;
              pvVar8 = (profile->profile64).similar;
              iVar43 = -open;
              iVar54 = ppVar6->min;
              uVar63 = 0x8000000000000000 - (long)iVar54;
              if (iVar54 != iVar43 && SBORROW4(iVar54,iVar43) == iVar54 + open < 0) {
                uVar63 = (ulong)(uint)open | 0x8000000000000000;
              }
              iVar54 = ppVar6->max;
              ppVar39 = parasail_result_new_table3((uint)((ulong)uVar4 + 1) & 0x7ffffffe,s2Len);
              if (ppVar39 != (parasail_result_t *)0x0) {
                ppVar39->flag =
                     (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                     (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar39->flag |
                     0x2830402;
                b = parasail_memalign___m128i(0x10,size);
                b_00 = parasail_memalign___m128i(0x10,size);
                b_01 = parasail_memalign___m128i(0x10,size);
                b_02 = parasail_memalign___m128i(0x10,size);
                ptr = parasail_memalign___m128i(0x10,size);
                b_03 = parasail_memalign___m128i(0x10,size);
                b_04 = parasail_memalign___m128i(0x10,size);
                b_05 = parasail_memalign___m128i(0x10,size);
                ptr_00 = parasail_memalign___m128i(0x10,size);
                ptr_01 = parasail_memalign___m128i(0x10,size);
                ptr_02 = parasail_memalign___m128i(0x10,size);
                ptr_03 = parasail_memalign___m128i(0x10,size);
                ptr_04 = parasail_memalign___m128i(0x10,size);
                ptr_05 = parasail_memalign___m128i(0x10,size);
                ptr_06 = parasail_memalign_int64_t(0x10,(ulong)(s2Len + 1));
                auVar68._0_8_ = -(ulong)(b == (__m128i *)0x0);
                auVar68._8_8_ = -(ulong)(b_00 == (__m128i *)0x0);
                auVar101._0_8_ = -(ulong)(b_01 == (__m128i *)0x0);
                auVar101._8_8_ = -(ulong)(b_02 == (__m128i *)0x0);
                auVar68 = packssdw(auVar68,auVar101);
                auVar87._0_8_ = -(ulong)(ptr == (__m128i *)0x0);
                auVar87._8_8_ = -(ulong)(b_03 == (__m128i *)0x0);
                auVar107._0_8_ = -(ulong)(b_04 == (__m128i *)0x0);
                auVar107._8_8_ = -(ulong)(b_05 == (__m128i *)0x0);
                auVar87 = packssdw(auVar87,auVar107);
                auVar68 = packssdw(auVar68,auVar87);
                if (((((ptr_04 != (__m128i *)0x0 && ptr_03 != (__m128i *)0x0) &&
                      ptr_05 != (__m128i *)0x0) &&
                     ((ptr_01 != (__m128i *)0x0 && ptr_00 != (__m128i *)0x0) &&
                     ptr_02 != (__m128i *)0x0)) && ptr_06 != (int64_t *)0x0) &&
                    ((((((((((((((((auVar68 >> 7 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  && (auVar68 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                 (auVar68 >> 0x17 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                                && (auVar68 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                               (auVar68 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                              && (auVar68 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                             && (auVar68 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                            && (auVar68 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                           && (auVar68 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar68 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar68 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar68 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                       (auVar68 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (auVar68 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                     (auVar68 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar68[0xf])) {
                  uVar37 = s2Len - 1;
                  uVar44 = 1 - (int)(uVar53 / size);
                  len = (size_t)uVar44;
                  uVar66 = (ulong)(uint)gap;
                  local_3d8 = (__m128i *)(uVar63 + 1);
                  local_178._0_8_ = 0x7ffffffffffffffe - (long)iVar54;
                  auVar69._8_4_ = (int)local_3d8;
                  auVar69._0_8_ = local_3d8;
                  auVar69._12_4_ = (int)((ulong)local_3d8 >> 0x20);
                  auVar88._8_4_ = (int)local_178._0_8_;
                  auVar88._0_8_ = local_178._0_8_;
                  auVar88._12_4_ = (int)((ulong)local_178._0_8_ >> 0x20);
                  auVar89._0_8_ = (long)(int)uVar44;
                  auVar89._8_4_ = uVar44;
                  auVar89._12_4_ = (int)uVar44 >> 0x1f;
                  alVar114[1] = (longlong)local_3d8;
                  alVar114[0] = size;
                  parasail_memset___m128i(b_03,alVar114,len);
                  alVar112[1] = extraout_RDX;
                  alVar112[0] = size;
                  parasail_memset___m128i(b_04,alVar112,len);
                  alVar113[1] = extraout_RDX_00;
                  alVar113[0] = size;
                  parasail_memset___m128i(b_05,alVar113,len);
                  alVar115[1] = extraout_RDX_01;
                  alVar115[0] = size;
                  parasail_memset___m128i(b,alVar115,len);
                  c[1] = extraout_RDX_02;
                  c[0] = size;
                  parasail_memset___m128i(b_00,c,len);
                  c_00[1] = extraout_RDX_03;
                  c_00[0] = size;
                  parasail_memset___m128i(b_01,c_00,len);
                  c_01[1] = extraout_RDX_04;
                  c_01[0] = size;
                  parasail_memset___m128i(b_02,c_01,len);
                  lVar96 = -(ulong)(uint)open;
                  lVar103 = -(ulong)(uint)open;
                  uVar9 = (uint)size;
                  uVar38 = uVar9 - 1;
                  alVar70 = (__m128i)pmovsxbq(extraout_XMM0,0x101);
                  auVar90._8_4_ = 0xffffffff;
                  auVar90._0_8_ = 0xffffffffffffffff;
                  auVar90._12_4_ = 0xffffffff;
                  for (uVar45 = uVar38; -1 < (int)uVar45; uVar45 = uVar45 - 1) {
                    ptr_04[uVar45][0] = lVar96;
                    ptr_04[uVar45][1] = lVar103;
                    ptr_05[uVar45] = alVar70;
                    uStack_150 = (ulong)(uint)gap;
                    lVar96 = lVar96 - uVar66;
                    lVar103 = lVar103 - uStack_150;
                    lVar59 = alVar70[1];
                    alVar70[0] = alVar70[0] + 1;
                    alVar70[1] = lVar59 - auVar90._8_8_;
                  }
                  lVar96 = (long)iVar43;
                  for (uVar58 = 0; uVar58 != size; uVar58 = uVar58 + 1) {
                    lVar103 = lVar96;
                    for (lVar59 = 0; lVar59 != 2; lVar59 = lVar59 + 1) {
                      lVar48 = lVar103;
                      if (s1_beg != 0) {
                        lVar48 = 0;
                      }
                      *(long *)((long)&h + lVar59 * 8) = lVar48;
                      lVar103 = lVar103 - size * (uint)gap;
                    }
                    ptr[uVar58][0] = h.m[0];
                    ptr[uVar58][1] = h.m[1];
                    lVar96 = lVar96 - (ulong)(uint)gap;
                  }
                  *ptr_06 = 0;
                  for (uVar58 = 1; s2Len + 1 != uVar58; uVar58 = uVar58 + 1) {
                    iVar54 = 0;
                    if (s2_beg == 0) {
                      iVar54 = iVar43;
                    }
                    ptr_06[uVar58] = (long)iVar54;
                    iVar43 = iVar43 - gap;
                  }
                  palVar1 = ptr + uVar38;
                  palVar40 = ptr + uVar49;
                  palVar41 = b_03 + uVar49;
                  palVar47 = b_04 + uVar49;
                  palVar56 = b_05 + uVar49;
                  palVar42 = (__m128i *)(size * uVar65 * 4);
                  local_240 = 0;
                  local_1c8._8_8_ = auVar89._8_8_;
                  local_1c8._8_8_ = -(ulong)(local_1c8._8_8_ == 0);
                  local_1c8._0_8_ = -(ulong)(auVar89._0_8_ == 1);
                  uStack_c0 = auVar88._8_8_;
                  local_178._8_8_ = uStack_c0;
                  uVar49 = 0;
                  palVar52 = b_05;
                  palVar57 = palVar56;
                  auVar68 = auVar69;
                  auVar87 = auVar69;
                  auVar101 = auVar69;
                  auVar107 = auVar69;
                  uVar45 = uVar37;
                  local_168 = auVar69;
                  while (uVar58 = (ulong)uVar45, uVar49 != uVar65) {
                    auVar92._8_4_ = (int)(*palVar1)[0];
                    auVar92._0_8_ = (*palVar1)[0];
                    auVar92._12_4_ = *(undefined4 *)((long)*palVar1 + 4);
                    lVar48 = (long)(int)(ppVar6->mapper[(byte)s2[uVar49]] * uVar9) * 0x10;
                    lStack_1b0 = auVar69._8_8_;
                    auVar111._0_8_ = (long)local_3d8 - (*ptr_04)[0];
                    auVar111._8_8_ = lStack_1b0 - (*ptr_04)[1];
                    local_3b8 = (undefined1  [16])0x0;
                    lVar60 = 0;
                    local_378 = (undefined1  [16])0x0;
                    local_368 = (undefined1  [16])0x0;
                    auVar99._8_8_ = uStack_220;
                    auVar99._0_8_ = local_228;
                    uVar51 = uVar49;
                    iVar110 = ptr_06[uVar49];
                    local_208._8_8_ = auVar92._8_8_;
                    local_308._0_8_ = local_3d8;
                    lVar96 = 0;
                    lVar55 = b_03[uVar38][0];
                    lVar103 = 0;
                    lVar64 = b_04[uVar38][0];
                    lVar59 = 0;
                    lVar61 = b_05[uVar38][0];
                    while( true ) {
                      local_308._8_8_ = lStack_1b0;
                      uStack_220 = auVar99._0_8_;
                      uStack_150 = (ulong)(uint)gap;
                      if (size << 4 == lVar60) break;
                      plVar3 = (long *)((long)*ptr + lVar60);
                      lVar14 = *plVar3;
                      lVar15 = plVar3[1];
                      pauVar2 = (undefined1 (*) [16])((long)*b_03 + lVar60);
                      lVar22 = *(long *)*pauVar2;
                      lVar23 = *(long *)(*pauVar2 + 8);
                      auVar90 = *pauVar2;
                      pauVar2 = (undefined1 (*) [16])((long)*b_04 + lVar60);
                      lVar24 = *(long *)*pauVar2;
                      lVar25 = *(long *)(*pauVar2 + 8);
                      auVar92 = *pauVar2;
                      pauVar2 = (undefined1 (*) [16])((long)*b_05 + lVar60);
                      lVar26 = *(long *)*pauVar2;
                      lVar27 = *(long *)(*pauVar2 + 8);
                      auVar34 = *pauVar2;
                      plVar3 = (long *)((long)*b + lVar60);
                      auVar88 = *(undefined1 (*) [16])((long)*b_00 + lVar60);
                      auVar89 = *(undefined1 (*) [16])((long)*b_01 + lVar60);
                      auVar98 = *(undefined1 (*) [16])((long)*b_02 + lVar60);
                      lVar67 = lVar14 - (ulong)(uint)open;
                      lVar85 = lVar15 - (ulong)(uint)open;
                      local_2f8._0_8_ = *plVar3 - uVar66;
                      local_2f8._8_8_ = plVar3[1] - uStack_150;
                      plVar3 = (long *)((long)*ptr_04 + lVar60);
                      local_218._0_8_ = auVar111._0_8_ + *plVar3;
                      local_218._8_8_ = auVar111._8_8_ + plVar3[1];
                      plVar3 = (long *)((long)*ptr_05 + lVar60);
                      lVar16 = *plVar3;
                      lVar17 = plVar3[1];
                      plVar3 = (long *)((long)pvVar5 + lVar60 + lVar48);
                      local_208._0_8_ = iVar110 + *plVar3;
                      local_208._8_8_ = local_208._8_8_ + plVar3[1];
                      plVar3 = (long *)((long)pvVar7 + lVar60 + lVar48);
                      lVar18 = *plVar3;
                      lVar19 = plVar3[1];
                      plVar3 = (long *)((long)pvVar8 + lVar60 + lVar48);
                      lVar20 = *plVar3;
                      lVar21 = plVar3[1];
                      a[1] = (longlong)palVar57;
                      a[0] = uVar58;
                      b_06[1] = (longlong)b_05;
                      b_06[0] = uVar51;
                      palVar52 = b_05;
                      alVar70 = _mm_cmpgt_epi64_rpl(a,b_06);
                      b_07[0] = alVar70[1];
                      auVar88 = pblendvb(auVar88,auVar90,extraout_XMM0_00);
                      auVar89 = pblendvb(auVar89,auVar92,extraout_XMM0_00);
                      auVar90 = pblendvb(auVar98,auVar34,extraout_XMM0_00);
                      auVar71._8_4_ = 0xffffffff;
                      auVar71._0_8_ = 0xffffffffffffffff;
                      auVar71._12_4_ = 0xffffffff;
                      a_00[1] = (longlong)palVar57;
                      a_00[0] = uVar58;
                      b_07[1] = (longlong)palVar52;
                      alVar70 = _mm_cmpgt_epi64_rpl(a_00,b_07);
                      b_08[0] = alVar70[1];
                      auVar91._0_8_ = -(ulong)(local_308._0_8_ == local_218._0_8_);
                      auVar91._8_8_ = -(ulong)(lStack_1b0 == local_218._8_8_);
                      auVar91 = extraout_XMM0_01 | auVar91;
                      auVar72._0_8_ = -(ulong)((long)local_218._0_8_ < (long)local_308._0_8_);
                      auVar72._8_8_ = -(ulong)((long)local_218._8_8_ < lStack_1b0);
                      auVar98 = blendvpd(local_218,local_308,auVar72);
                      local_3b8 = pblendvb(local_2b8,local_3b8,auVar91);
                      local_378 = pblendvb(local_2c8,local_378,auVar91);
                      auVar30._8_8_ = auVar99._8_8_ + lVar17;
                      auVar30._0_8_ = uStack_220 + lVar16;
                      local_368 = pblendvb(auVar30,local_368,auVar91);
                      auVar32._8_8_ = lVar85;
                      auVar32._0_8_ = lVar67;
                      auVar73._0_8_ = -(ulong)((long)local_2f8._0_8_ < lVar67);
                      auVar73._8_8_ = -(ulong)((long)local_2f8._8_8_ < lVar85);
                      auVar92 = blendvpd(local_2f8,auVar32,auVar73);
                      a_01[1] = (longlong)palVar57;
                      a_01[0] = uVar58;
                      b_08[1] = (longlong)palVar52;
                      alVar70 = _mm_cmpgt_epi64_rpl(a_01,b_08);
                      uVar51 = alVar70[1];
                      auVar74._0_8_ = -(ulong)((long)local_208._0_8_ < auVar92._0_8_);
                      auVar74._8_8_ = -(ulong)((long)local_208._8_8_ < auVar92._8_8_);
                      auVar111 = blendvpd(local_208,auVar92,auVar74);
                      auVar33._8_8_ = lVar55 + lVar19;
                      auVar33._0_8_ = lVar96 + lVar18;
                      local_2b8 = pblendvb(auVar33,auVar88,extraout_XMM0_02);
                      auVar31._8_8_ = lVar64 + lVar21;
                      auVar31._0_8_ = lVar103 + lVar20;
                      local_2c8 = pblendvb(auVar31,auVar89,extraout_XMM0_02);
                      auVar28._8_8_ = lVar61 + 1;
                      auVar28._0_8_ = lVar59 + 1;
                      auVar29._8_8_ = auVar90._8_8_ - auVar71._8_8_;
                      auVar29._0_8_ = auVar90._0_8_ + 1;
                      auVar99 = pblendvb(auVar28,auVar29,extraout_XMM0_02);
                      *(undefined1 (*) [16])((long)*b + lVar60) = auVar92;
                      *(undefined1 (*) [16])((long)*b_00 + lVar60) = auVar88;
                      *(undefined1 (*) [16])((long)*b_01 + lVar60) = auVar89;
                      *(undefined1 (*) [16])((long)*b_02 + lVar60) = auVar29;
                      *(undefined1 (*) [16])((long)*ptr + lVar60) = local_208;
                      *(undefined1 (*) [16])((long)*b_03 + lVar60) = auVar33;
                      *(undefined1 (*) [16])((long)*b_04 + lVar60) = auVar31;
                      *(undefined1 (*) [16])((long)*b_05 + lVar60) = auVar28;
                      lVar60 = lVar60 + 0x10;
                      local_308._0_8_ = auVar98._0_8_;
                      local_308._8_8_ = auVar98._8_8_;
                      iVar110 = lVar14;
                      local_208._8_8_ = lVar15;
                      lStack_1b0 = local_308._8_8_;
                      lVar96 = lVar22;
                      lVar55 = lVar23;
                      lVar103 = lVar24;
                      lVar64 = lVar25;
                      lVar59 = lVar26;
                      lVar61 = lVar27;
                    }
                    auVar106._8_4_ = auVar111._0_4_;
                    auVar106._0_8_ = auVar111._0_8_;
                    auVar106._12_4_ = auVar111._4_4_;
                    auVar98._8_8_ = 0;
                    auVar98._0_8_ = local_2b8._0_8_;
                    local_2b8 = auVar98 << 0x40;
                    auVar34._8_8_ = 0;
                    auVar34._0_8_ = local_2c8._0_8_;
                    local_2c8 = auVar34 << 0x40;
                    local_228 = 0;
                    local_398._0_8_ = ptr_06[uVar49 + 1];
                    local_398._8_8_ = auVar106._8_8_;
                    lVar96 = (*ptr_04)[1];
                    local_388._8_8_ = (*ptr_04)[0] + local_398._0_8_;
                    alVar70 = *ptr_05;
                    a_02[1] = (longlong)palVar57;
                    a_02[0] = uVar58;
                    b_09[1] = uVar49;
                    b_09[0] = uVar51;
                    alVar114 = _mm_cmpgt_epi64_rpl(a_02,b_09);
                    b_10[0] = alVar114[1];
                    auVar75._0_8_ = -(ulong)(local_388._8_8_ == local_308._0_8_);
                    auVar75._8_8_ = -(ulong)(lVar96 + local_398._8_8_ == lStack_1b0);
                    if ((long)local_388._8_8_ < (long)local_308._0_8_) {
                      local_388._8_8_ = local_308._0_8_;
                    }
                    auVar75 = extraout_XMM0_03 | auVar75;
                    auVar88 = pblendvb(local_3b8,local_2b8,auVar75);
                    auVar89 = pblendvb(local_378,local_2c8,auVar75);
                    auVar90 = pblendvb(local_368,(undefined1  [16])alVar70,auVar75);
                    auVar35._8_8_ = 0;
                    auVar35._0_8_ = auVar88._0_8_;
                    local_3b8 = auVar35 << 0x40;
                    local_378._8_8_ = 0;
                    local_378._0_8_ = auVar89._0_8_;
                    local_378 = local_378 << 0x40;
                    auVar109._8_8_ = 0;
                    auVar109._0_8_ = auVar90._0_8_;
                    local_368 = auVar109 << 0x40;
                    local_388._0_8_ = local_3d8;
                    a_03[1] = (longlong)palVar57;
                    a_03[0] = uVar58;
                    b_10[1] = local_308._0_8_;
                    alVar70 = _mm_cmpgt_epi64_rpl(a_03,b_10);
                    auVar76._0_8_ = -(ulong)((long)local_398._0_8_ < (long)local_3d8);
                    auVar76._8_8_ = -(ulong)((long)local_398._8_8_ < (long)local_388._8_8_);
                    auVar90 = blendvpd(local_398,local_388,auVar76);
                    auVar99 = pblendvb(local_2b8,local_3b8,extraout_XMM0_04);
                    auVar89 = pblendvb(local_2c8,local_378,extraout_XMM0_04);
                    auVar36._8_8_ = 0;
                    auVar36._0_8_ = uStack_220;
                    auVar88 = pblendvb(auVar36 << 0x40,local_368,extraout_XMM0_04);
                    palVar52 = alVar70[1];
                    lVar96 = local_240;
                    for (lVar103 = 0; size << 4 != lVar103; lVar103 = lVar103 + 0x10) {
                      pauVar2 = (undefined1 (*) [16])((long)*ptr + lVar103);
                      lVar59 = *(long *)*pauVar2;
                      lVar48 = *(long *)(*pauVar2 + 8);
                      auVar98 = *pauVar2;
                      auVar92 = *(undefined1 (*) [16])((long)*b_03 + lVar103);
                      auVar111 = *(undefined1 (*) [16])((long)*b_04 + lVar103);
                      auVar35 = *(undefined1 (*) [16])((long)*b_05 + lVar103);
                      auVar34 = *(undefined1 (*) [16])((long)*b_00 + lVar103);
                      auVar75 = *(undefined1 (*) [16])((long)*b_01 + lVar103);
                      auVar106 = *(undefined1 (*) [16])((long)*b_02 + lVar103);
                      local_398._0_8_ = auVar90._0_8_ - (ulong)(uint)open;
                      local_398._8_8_ = auVar90._8_8_ - (ulong)(uint)open;
                      lVar60 = local_388._0_8_ - uVar66;
                      local_388._8_8_ = local_388._8_8_ - uStack_150;
                      local_388._0_8_ = lVar60;
                      a_04[1] = (longlong)palVar57;
                      a_04[0] = uVar58;
                      b_11[1] = (longlong)b_04;
                      b_11[0] = (longlong)palVar52;
                      _mm_cmpgt_epi64_rpl(a_04,b_11);
                      local_3b8 = pblendvb(local_3b8,auVar99,extraout_XMM0_05);
                      local_378 = pblendvb(local_378,auVar89,extraout_XMM0_05);
                      auVar109 = pblendvb(local_368,auVar88,extraout_XMM0_05);
                      auVar77._0_8_ = -(ulong)(lVar60 < (long)local_398._0_8_);
                      auVar77._8_8_ = -(ulong)((long)local_388._8_8_ < (long)local_398._8_8_);
                      local_388 = blendvpd(local_388,local_398,auVar77);
                      auVar88 = *(undefined1 (*) [16])((long)*b + lVar103);
                      auVar78._0_8_ = -(ulong)(auVar88._0_8_ < lVar59);
                      auVar78._8_8_ = -(ulong)(auVar88._8_8_ < lVar48);
                      auVar88 = blendvpd(auVar88,auVar98,auVar78);
                      auVar93._0_8_ = -(ulong)(local_388._0_8_ < auVar88._0_8_);
                      auVar93._8_8_ = -(ulong)(local_388._8_8_ < auVar88._8_8_);
                      auVar90 = blendvpd(local_388,auVar88,auVar93);
                      auVar88 = blendvpd(local_3b8,auVar34,auVar93);
                      lVar60 = auVar90._0_8_;
                      auVar100._0_8_ = -(ulong)(lVar59 == lVar60);
                      lVar59 = auVar90._8_8_;
                      auVar100._8_8_ = -(ulong)(lVar48 == lVar59);
                      auVar99 = blendvpd(auVar88,auVar92,auVar100);
                      auVar88 = blendvpd(local_378,auVar75,auVar93);
                      auVar89 = blendvpd(auVar88,auVar111,auVar100);
                      local_368._0_8_ = auVar109._0_8_ + 1;
                      local_368._8_8_ = auVar109._8_8_ + 1;
                      auVar88 = blendvpd(local_368,auVar106,auVar93);
                      auVar88 = blendvpd(auVar88,auVar35,auVar100);
                      *(undefined1 (*) [16])((long)*ptr + lVar103) = auVar90;
                      *(undefined1 (*) [16])((long)*b_03 + lVar103) = auVar99;
                      *(undefined1 (*) [16])((long)*b_04 + lVar103) = auVar89;
                      *(undefined1 (*) [16])((long)*b_05 + lVar103) = auVar88;
                      auVar79._0_8_ = -(ulong)(local_178._0_8_ < lVar60);
                      auVar79._8_8_ = -(ulong)(local_178._8_8_ < lVar59);
                      local_178 = blendvpd(auVar90,local_178,auVar79);
                      auVar80._0_8_ = -(ulong)(lVar60 < local_168._0_8_);
                      auVar80._8_8_ = -(ulong)(lVar59 < local_168._8_8_);
                      auVar92 = blendvpd(auVar90,local_168,auVar80);
                      auVar81._0_8_ = -(ulong)(auVar99._0_8_ < auVar92._0_8_);
                      auVar81._8_8_ = -(ulong)(auVar99._8_8_ < auVar92._8_8_);
                      auVar92 = blendvpd(auVar99,auVar92,auVar81);
                      auVar82._0_8_ = -(ulong)(auVar89._0_8_ < auVar92._0_8_);
                      auVar82._8_8_ = -(ulong)(auVar89._8_8_ < auVar92._8_8_);
                      lVar59 = *((ppVar39->field_4).trace)->trace_del_table;
                      *(int *)(lVar59 + lVar96) = auVar90._0_4_;
                      *(int *)((long)*palVar42 + lVar59 + lVar96) = auVar90._8_4_;
                      auVar92 = blendvpd(auVar89,auVar92,auVar82);
                      lVar59 = *(long *)((long)((ppVar39->field_4).trace)->trace_del_table + 8);
                      *(int *)(lVar59 + lVar96) = auVar99._0_4_;
                      *(int *)((long)*palVar42 + lVar59 + lVar96) = auVar99._8_4_;
                      auVar83._0_8_ = -(ulong)(auVar88._0_8_ < auVar92._0_8_);
                      auVar83._8_8_ = -(ulong)(auVar88._8_8_ < auVar92._8_8_);
                      lVar59 = *(long *)((long)((ppVar39->field_4).trace)->trace_del_table + 0x10);
                      *(int *)(lVar59 + lVar96) = auVar89._0_4_;
                      *(int *)((long)*palVar42 + lVar59 + lVar96) = auVar89._8_4_;
                      local_168 = blendvpd(auVar88,auVar92,auVar83);
                      lVar59 = *(long *)((long)((ppVar39->field_4).trace)->trace_del_table + 0x18);
                      *(int *)(lVar59 + lVar96) = auVar88._0_4_;
                      *(int *)((long)*palVar42 + lVar59 + lVar96) = auVar88._8_4_;
                      lVar96 = lVar96 + uVar65 * 4;
                      palVar52 = b;
                      palVar57 = palVar42;
                    }
                    lVar96 = (*palVar40)[0];
                    lVar103 = (*palVar40)[1];
                    alVar70 = *palVar40;
                    alVar114 = *palVar41;
                    alVar112 = *palVar47;
                    alVar113 = *palVar56;
                    a_05[1] = (longlong)palVar57;
                    a_05[0] = uVar58;
                    b_12[1] = (longlong)b_04;
                    b_12[0] = (longlong)palVar52;
                    alVar115 = _mm_cmpgt_epi64_rpl(a_05,b_12);
                    palVar52 = alVar115[1];
                    auVar84._0_8_ = -(ulong)(lVar96 < auVar87._0_8_);
                    auVar84._8_8_ = -(ulong)(lVar103 < auVar87._8_8_);
                    auVar87 = blendvpd((undefined1  [16])alVar70,auVar87,auVar84);
                    auVar101 = pblendvb(auVar101,(undefined1  [16])alVar114,extraout_XMM0_06);
                    auVar107 = pblendvb(auVar107,(undefined1  [16])alVar112,extraout_XMM0_06);
                    auVar68 = pblendvb(auVar68,(undefined1  [16])alVar113,extraout_XMM0_06);
                    auVar88 = extraout_XMM0_06 & local_1c8;
                    local_238 = (uint)uVar49;
                    if ((((((((((((((((auVar88 >> 7 & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0 ||
                                     (auVar88 >> 0xf & (undefined1  [16])0x1) !=
                                     (undefined1  [16])0x0) ||
                                    (auVar88 >> 0x17 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                                   (auVar88 >> 0x1f & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                                  (auVar88 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar88 >> 0x2f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar88 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar88 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar88 >> 0x47 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar88 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar88 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar88 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar88 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar88 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar88 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        auVar88[0xf] < '\0') {
                      uVar45 = local_238;
                    }
                    local_240 = local_240 + 4;
                    uVar49 = uVar49 + 1;
                  }
                  lVar55 = 0;
                  if (s2_end == 0) {
                    lVar64 = 0;
                    lVar61 = 0;
                  }
                  else {
                    uVar49 = 1;
                    while( true ) {
                      iVar54 = (int)lVar55;
                      local_3d8 = auVar87._8_8_;
                      lVar55 = auVar101._8_8_;
                      lVar64 = auVar107._8_8_;
                      lVar61 = auVar68._8_8_;
                      if ((int)uVar44 <= iVar54) break;
                      auVar10._8_8_ = 0;
                      auVar10._0_8_ = auVar87._0_8_;
                      auVar87 = auVar10 << 0x40;
                      auVar11._8_8_ = 0;
                      auVar11._0_8_ = auVar101._0_8_;
                      auVar101 = auVar11 << 0x40;
                      auVar12._8_8_ = 0;
                      auVar12._0_8_ = auVar107._0_8_;
                      auVar107 = auVar12 << 0x40;
                      auVar13._8_8_ = 0;
                      auVar13._0_8_ = auVar68._0_8_;
                      auVar68 = auVar13 << 0x40;
                      lVar55 = 1;
                    }
                  }
                  iVar43 = (int)lVar61;
                  iVar62 = (int)lVar64;
                  iVar54 = (int)lVar55;
                  uVar45 = uVar53;
                  if (s1_end != 0) {
                    uVar49 = 0;
                    while( true ) {
                      iVar43 = (int)lVar61;
                      iVar62 = (int)lVar64;
                      iVar54 = (int)lVar55;
                      if ((uVar9 & 0x3fffffff) * 2 == (int)uVar49) break;
                      palVar57 = (__m128i *)(uVar49 >> 1 & 0x7fffffff);
                      uVar38 = 0;
                      if ((uVar49 & 1) != 0) {
                        uVar38 = uVar9;
                      }
                      uVar38 = uVar38 + (int)palVar57;
                      palVar52 = (__m128i *)(ulong)uVar38;
                      if ((int)uVar38 < (int)uVar4) {
                        palVar57 = (__m128i *)(*ptr)[uVar49];
                        if (((long)local_3d8 < (long)palVar57) ||
                           (((palVar57 == local_3d8 && ((uint)uVar58 == uVar37)) &&
                            (palVar57 = local_3d8, (int)uVar38 < (int)uVar45)))) {
                          lVar55 = (*b_03)[uVar49];
                          lVar64 = (*b_04)[uVar49];
                          lVar61 = (*b_05)[uVar49];
                          uVar58 = (ulong)uVar37;
                          uVar45 = uVar38;
                          local_3d8 = palVar57;
                        }
                      }
                      uVar49 = uVar49 + 1;
                    }
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    uVar49 = 0;
                    lVar55 = (*palVar40)[0];
                    lVar64 = (*palVar40)[1];
                    lVar61 = (*palVar41)[0];
                    lVar95 = (*palVar41)[1];
                    lVar86 = (*palVar47)[0];
                    lVar104 = (*palVar47)[1];
                    lVar97 = (*palVar56)[0];
                    lVar108 = (*palVar56)[1];
                    while (lVar105 = lVar97, lVar97 = lVar86, lVar86 = lVar61, lVar61 = lVar55,
                          local_3d8._0_4_ = (int)lVar64, (int)uVar49 < (int)uVar44) {
                      lVar55 = 0;
                      lVar64 = lVar61;
                      lVar61 = 0;
                      lVar95 = lVar86;
                      lVar86 = 0;
                      lVar104 = lVar97;
                      lVar97 = 0;
                      lVar108 = lVar105;
                      uVar49 = 1;
                    }
                    iVar54 = (int)lVar95;
                    iVar62 = (int)lVar104;
                    iVar43 = (int)lVar108;
                    uVar58 = (ulong)uVar37;
                    uVar45 = uVar53;
                  }
                  local_2a0 = (undefined4)uVar63;
                  uStack_29c = (undefined4)(uVar63 >> 0x20);
                  local_3b8._8_4_ = local_2a0;
                  local_3b8._0_8_ = uVar63;
                  local_3b8._12_4_ = uStack_29c;
                  a_06[1] = (longlong)palVar57;
                  a_06[0] = uVar58;
                  b_13[1] = uVar49;
                  b_13[0] = (longlong)palVar52;
                  _mm_cmpgt_epi64_rpl(a_06,b_13);
                  iVar46 = (int)uVar58;
                  auVar102._0_8_ = -(ulong)((long)uVar63 < (long)local_178._0_8_);
                  auVar102._8_8_ = -(ulong)((long)local_3b8._8_8_ < (long)local_178._8_8_);
                  auVar94._8_4_ = 0xffffffff;
                  auVar94._0_8_ = 0xffffffffffffffff;
                  auVar94._12_4_ = 0xffffffff;
                  auVar68 = auVar94 ^ auVar102 | extraout_XMM0_07;
                  if ((((((((((((((((auVar68 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar68 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar68 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar68 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar68 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar68 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar68 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar68 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar68 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar68 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar68 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar68 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar68 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar68 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar68 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar68[0xf] < '\0') {
                    *(byte *)&ppVar39->flag = (byte)ppVar39->flag | 0x40;
                    local_3d8._0_4_ = 0;
                    iVar54 = 0;
                    iVar62 = 0;
                    iVar43 = 0;
                    iVar46 = 0;
                    uVar45 = 0;
                  }
                  ppVar39->score = (int)local_3d8;
                  ppVar39->end_query = uVar45;
                  ppVar39->end_ref = iVar46;
                  ((ppVar39->field_4).stats)->matches = iVar54;
                  ((ppVar39->field_4).stats)->similar = iVar62;
                  ((ppVar39->field_4).stats)->length = iVar43;
                  parasail_free(ptr_06);
                  parasail_free(ptr_05);
                  parasail_free(ptr_04);
                  parasail_free(ptr_03);
                  parasail_free(ptr_02);
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(b_05);
                  parasail_free(b_04);
                  parasail_free(b_03);
                  parasail_free(ptr);
                  parasail_free(b_02);
                  parasail_free(b_01);
                  parasail_free(b_00);
                  parasail_free(b);
                  return ppVar39;
                }
              }
              return (parasail_result_t *)0x0;
            }
            __format = "%s: %s must be >= 0\n";
            pcVar50 = "gap";
          }
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sg_flags_stats_table_scan_profile_sse41_128_64",pcVar50);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvPm = NULL;
    __m128i* restrict pvPs = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvEM = NULL;
    __m128i* restrict pvES = NULL;
    __m128i* restrict pvEL = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHM = NULL;
    __m128i* restrict pvHS = NULL;
    __m128i* restrict pvHL = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvHMMax = NULL;
    __m128i* restrict pvHSMax = NULL;
    __m128i* restrict pvHLMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i* restrict pvGapperL = NULL;
    int64_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    __m128i vZero;
    __m128i vOne;
    int64_t score = 0;
    int64_t matches = 0;
    int64_t similar = 0;
    int64_t length = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxM;
    __m128i vMaxS;
    __m128i vMaxL;
    __m128i vPosMask;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    __m128i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    pvP  = (__m128i*)profile->profile64.score;
    pvPm = (__m128i*)profile->profile64.matches;
    pvPs = (__m128i*)profile->profile64.similar;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    vOne = _mm_set1_epi64x_rpl(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vPosMask = _mm_cmpeq_epi64(_mm_set1_epi64x_rpl(position),
            _mm_set_epi64x_rpl(0,1));
    vNegInfFront = vZero;
    vSegLen = _mm_slli_si128(_mm_set1_epi64x_rpl(segLen), 8);
    vNegInfFront = _mm_insert_epi64_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_add_epi64(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi64x_rpl(-segLen*gap), 8));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m128i(16, segLen);
    pvEM = parasail_memalign___m128i(16, segLen);
    pvES = parasail_memalign___m128i(16, segLen);
    pvEL = parasail_memalign___m128i(16, segLen);
    pvH  = parasail_memalign___m128i(16, segLen);
    pvHM = parasail_memalign___m128i(16, segLen);
    pvHS = parasail_memalign___m128i(16, segLen);
    pvHL = parasail_memalign___m128i(16, segLen);
    pvHMax  = parasail_memalign___m128i(16, segLen);
    pvHMMax = parasail_memalign___m128i(16, segLen);
    pvHSMax = parasail_memalign___m128i(16, segLen);
    pvHLMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);
    pvGapperL = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int64_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;
    if (!boundary) return NULL;

    parasail_memset___m128i(pvHM, vZero, segLen);
    parasail_memset___m128i(pvHS, vZero, segLen);
    parasail_memset___m128i(pvHL, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    parasail_memset___m128i(pvEM, vZero, segLen);
    parasail_memset___m128i(pvES, vZero, segLen);
    parasail_memset___m128i(pvEL, vZero, segLen);
    {
        __m128i vGapper = _mm_sub_epi64(vZero,vGapO);
        __m128i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            _mm_store_si128(pvGapperL+i, vGapperL);
            vGapper = _mm_sub_epi64(vGapper, vGapE);
            vGapperL = _mm_add_epi64(vGapperL, vOne);
        }
    }

    /* initialize H */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_64_t h;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT64_MIN ? INT64_MIN : tmp;
            }
            _mm_store_si128(&pvH[index], h.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT64_MIN ? INT64_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vE_ext;
        __m128i vE_opn;
        __m128i vEM;
        __m128i vES;
        __m128i vEL;
        __m128i vHt;
        __m128i vHtM;
        __m128i vHtS;
        __m128i vHtL;
        __m128i vF;
        __m128i vF_ext;
        __m128i vF_opn;
        __m128i vFM;
        __m128i vFS;
        __m128i vFL;
        __m128i vH;
        __m128i vHM;
        __m128i vHS;
        __m128i vHL;
        __m128i vHp;
        __m128i vHpM;
        __m128i vHpS;
        __m128i vHpL;
        __m128i *pvW;
        __m128i vW;
        __m128i *pvWM;
        __m128i vWM;
        __m128i *pvWS;
        __m128i vWS;
        __m128i case1;
        __m128i case2;
        __m128i vGapper;
        __m128i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHpM = _mm_load_si128(pvHM+(segLen-1));
        vHpS = _mm_load_si128(pvHS+(segLen-1));
        vHpL = _mm_load_si128(pvHL+(segLen-1));
        vHp = _mm_slli_si128(vHp, 8);
        vHpM = _mm_slli_si128(vHpM, 8);
        vHpS = _mm_slli_si128(vHpS, 8);
        vHpL = _mm_slli_si128(vHpL, 8);
        vHp = _mm_insert_epi64_rpl(vHp, boundary[j], 0);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = _mm_sub_epi64(vNegLimit, pvGapper[0]);
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vHM= _mm_load_si128(pvHM+i);
            vHS= _mm_load_si128(pvHS+i);
            vHL= _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM= _mm_load_si128(pvEM+i);
            vES= _mm_load_si128(pvES+i);
            vEL= _mm_load_si128(pvEL+i);
            vW = _mm_load_si128(pvW+i);
            vWM = _mm_load_si128(pvWM+i);
            vWS = _mm_load_si128(pvWS+i);
            vGapper = _mm_load_si128(pvGapper+i);
            vGapperL = _mm_load_si128(pvGapperL+i);
            vE_opn = _mm_sub_epi64(vH, vGapO);
            vE_ext = _mm_sub_epi64(vE, vGapE);
            case1 = _mm_cmpgt_epi64_rpl(vE_opn, vE_ext);
            vE = _mm_max_epi64_rpl(vE_opn, vE_ext);
            vEM = _mm_blendv_epi8(vEM, vHM, case1);
            vES = _mm_blendv_epi8(vES, vHS, case1);
            vEL = _mm_blendv_epi8(vEL, vHL, case1);
            vEL = _mm_add_epi64(vEL, vOne);
            vGapper = _mm_add_epi64(vHt, vGapper);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vF, vGapper),
                    _mm_cmpeq_epi64(vF, vGapper));
            vF = _mm_max_epi64_rpl(vF, vGapper);
            vFM = _mm_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm_blendv_epi8(
                    _mm_add_epi64(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm_add_epi64(vHp, vW);
            vHpM = _mm_add_epi64(vHpM, vWM);
            vHpS = _mm_add_epi64(vHpS, vWS);
            vHpL = _mm_add_epi64(vHpL, vOne);
            case1 = _mm_cmpgt_epi64_rpl(vE, vHp);
            vHt = _mm_max_epi64_rpl(vE, vHp);
            vHtM = _mm_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm_blendv_epi8(vHpL, vEL, case1);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvEM+i, vEM);
            _mm_store_si128(pvES+i, vES);
            _mm_store_si128(pvEL+i, vEL);
            _mm_store_si128(pvH+i, vHp);
            _mm_store_si128(pvHM+i, vHpM);
            _mm_store_si128(pvHS+i, vHpS);
            _mm_store_si128(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 8);
        vHtM = _mm_slli_si128(vHtM, 8);
        vHtS = _mm_slli_si128(vHtS, 8);
        vHtL = _mm_slli_si128(vHtL, 8);
        vHt = _mm_insert_epi64_rpl(vHt, boundary[j+1], 0);
        vGapper = _mm_load_si128(pvGapper);
        vGapperL = _mm_load_si128(pvGapperL);
        vGapper = _mm_add_epi64(vHt, vGapper);
        case1 = _mm_or_si128(
                _mm_cmpgt_epi64_rpl(vGapper, vF),
                _mm_cmpeq_epi64(vGapper, vF));
        vF = _mm_max_epi64_rpl(vF, vGapper);
        vFM = _mm_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm_blendv_epi8(
                vFL,
                _mm_add_epi64(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 8);
            __m128i vFtM = _mm_slli_si128(vFM, 8);
            __m128i vFtS = _mm_slli_si128(vFS, 8);
            __m128i vFtL = _mm_slli_si128(vFL, 8);
            vFt = _mm_add_epi64(vFt, vSegLenXgap);
            case1 = _mm_or_si128(
                    _mm_cmpgt_epi64_rpl(vFt, vF),
                    _mm_cmpeq_epi64(vFt, vF));
            vF = _mm_max_epi64_rpl(vF, vFt);
            vFM = _mm_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm_blendv_epi8(
                    vFL,
                    _mm_add_epi64(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 8);
        vFM = _mm_slli_si128(vFM, 8);
        vFS = _mm_slli_si128(vFS, 8);
        vFL = _mm_slli_si128(vFL, 8);
        vF = _mm_add_epi64(vF, vNegInfFront);
        case1 = _mm_cmpgt_epi64_rpl(vF, vHt);
        vH = _mm_max_epi64_rpl(vF, vHt);
        vHM = _mm_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm_load_si128(pvH+i);
            vHpM = _mm_load_si128(pvHM+i);
            vHpS = _mm_load_si128(pvHS+i);
            vHpL = _mm_load_si128(pvHL+i);
            vE = _mm_load_si128(pvE+i);
            vEM = _mm_load_si128(pvEM+i);
            vES = _mm_load_si128(pvES+i);
            vEL = _mm_load_si128(pvEL+i);
            vF_opn = _mm_sub_epi64(vH, vGapO);
            vF_ext = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF_opn, vF_ext);
            case1 = _mm_cmpgt_epi64_rpl(vF_opn, vF_ext);
            vFM = _mm_blendv_epi8(vFM, vHM, case1);
            vFS = _mm_blendv_epi8(vFS, vHS, case1);
            vFL = _mm_blendv_epi8(vFL, vHL, case1);
            vFL = _mm_add_epi64(vFL, vOne);
            vH = _mm_max_epi64_rpl(vHp, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            case1 = _mm_cmpeq_epi64(vH, vHp);
            case2 = _mm_cmpeq_epi64(vH, vF);
            vHM = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHS = _mm_blendv_epi8(
                    _mm_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHL = _mm_blendv_epi8(
                    _mm_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            _mm_store_si128(pvH+i, vH);
            _mm_store_si128(pvHM+i, vHM);
            _mm_store_si128(pvHS+i, vHS);
            _mm_store_si128(pvHL+i, vHL);
            vSaturationCheckMin = _mm_min_epi64_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm_max_epi64_rpl(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si128(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
        } 
        /* extract vector containing last value from column */
        {
            __m128i cond_max;
            vH = _mm_load_si128(pvH + offset);
            vHM = _mm_load_si128(pvHM + offset);
            vHS = _mm_load_si128(pvHS + offset);
            vHL = _mm_load_si128(pvHL + offset);
            cond_max = _mm_cmpgt_epi64_rpl(vH, vMaxH);
            vMaxH = _mm_max_epi64_rpl(vMaxH, vH);
            vMaxM = _mm_blendv_epi8(vMaxM, vHM, cond_max);
            vMaxS = _mm_blendv_epi8(vMaxS, vHS, cond_max);
            vMaxL = _mm_blendv_epi8(vMaxL, vHL, cond_max);
            if (_mm_movemask_epi8(_mm_and_si128(vPosMask, cond_max))) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
                vHM = _mm_slli_si128(vHM, 8);
                vHS = _mm_slli_si128(vHS, 8);
                vHL = _mm_slli_si128(vHL, 8);
            }
            result->stats->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
            result->stats->rowcols->matches_row[j] = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
            result->stats->rowcols->similar_row[j] = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
            result->stats->rowcols->length_row[j] = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        __m128i vHM = _mm_load_si128(pvHM+i);
        __m128i vHS = _mm_load_si128(pvHS+i);
        __m128i vHL = _mm_load_si128(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 8);
            vMaxM = _mm_slli_si128(vMaxM, 8);
            vMaxS = _mm_slli_si128(vMaxS, 8);
            vMaxL = _mm_slli_si128(vMaxL, 8);
        }
        end_query = s1Len-1;
        score = (int64_t) _mm_extract_epi64_rpl(vMaxH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl(vMaxM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl(vMaxS, 1);
        length = (int64_t) _mm_extract_epi64_rpl(vMaxL, 1);
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int64_t *t = (int64_t*)pvH;
        int64_t *m = (int64_t*)pvHM;
        int64_t *s = (int64_t*)pvHS;
        int64_t *l = (int64_t*)pvHL;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
                matches = *m;
                similar = *s;
                length = *l;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
                matches = *m;
                similar = *s;
                length = *l;
            }
        }
    }

    /* extract last value from the last column */
    if (!s1_end && !s2_end)
    {
        __m128i vH = _mm_load_si128(pvH + offset);
        __m128i vHM = _mm_load_si128(pvHM + offset);
        __m128i vHS = _mm_load_si128(pvHS + offset);
        __m128i vHL = _mm_load_si128(pvHL + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128(vH, 8);
            vHM = _mm_slli_si128(vHM, 8);
            vHS = _mm_slli_si128(vHS, 8);
            vHL = _mm_slli_si128(vHL, 8);
        }
        end_ref = s2Len - 1;
        end_query = s1Len - 1;
        score = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        matches = (int64_t) _mm_extract_epi64_rpl (vHM, 1);
        similar = (int64_t) _mm_extract_epi64_rpl (vHS, 1);
        length = (int64_t) _mm_extract_epi64_rpl (vHL, 1);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi64_rpl(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(boundary);
    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}